

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

Country * __thiscall Map::addNode(Map *this,int id,string *name,int continent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<Map::Country*,std::allocator<Map::Country*>> *pvVar2;
  iterator iVar3;
  Country *this_00;
  Country *thisCountry;
  Country *local_60;
  string local_58;
  Country *local_38;
  
  this_00 = (Country *)operator_new(0x30);
  local_58._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar1) {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  Country::Country(this_00,id,&local_58,continent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pvVar2 = (vector<Map::Country*,std::allocator<Map::Country*>> *)this->pMapCountries;
  iVar3._M_current = *(Country ***)(pvVar2 + 8);
  local_60 = this_00;
  if (iVar3._M_current == *(Country ***)(pvVar2 + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (pvVar2,iVar3,&local_60);
  }
  else {
    *iVar3._M_current = this_00;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
  }
  local_38 = local_60;
  pvVar2 = (vector<Map::Country*,std::allocator<Map::Country*>> *)
           (this->pMapContinents->
           super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)continent + -1]->pCountriesInContinent;
  iVar3._M_current = *(Country ***)(pvVar2 + 8);
  if (iVar3._M_current == *(Country ***)(pvVar2 + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (pvVar2,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_60;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
  }
  return local_60;
}

Assistant:

Map::Country* Map::addNode(int id, std::string name, int continent) {
    //create graph node
    auto* thisCountry = new Country(id, std::move(name), continent);
    //add node to graph (overall graph)
    pMapCountries->push_back(thisCountry);
    //add node to relevant subgraph
    (*pMapContinents)[continent - 1]->addCountry(thisCountry);
    return thisCountry;
}